

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

int usage(char *name)

{
  uint local_14;
  int i;
  char *name_local;
  
  printf("\nUsage:\n %s [options] mybios.rom\n\n",name);
  printf("Options:\n");
  printf(" -h        print usage and exit\n");
  printf(" -m XX     set tCWL (for timing entry size < 20)\n");
  printf(" -s XX     set the trap register\n");
  printf(" -i XXXX   print init script at XXXX and exit\n");
  printf(" -v        be verbose\n");
  printf(" -u        print unused\n");
  printf(" -b        print blocks\n");
  printf(" -p XXXX   set print mask, XXXX can be: ");
  for (local_14 = 0; local_14 < 0x1b; local_14 = local_14 + 1) {
    printf("%s, ",printmasks[(int)local_14].name);
  }
  printf("%s\n",printmasks[(int)local_14].name);
  printf("\nFor more details see code\n");
  return 1;
}

Assistant:

int usage(char* name) {
	int i;

	printf("\nUsage:\n %s [options] mybios.rom\n\n", name);
	printf("Options:\n");
	printf(" -h        print usage and exit\n");
	printf(" -m XX     set tCWL (for timing entry size < 20)\n");
	printf(" -s XX     set the trap register\n");
	printf(" -i XXXX   print init script at XXXX and exit\n");
	printf(" -v        be verbose\n");
	printf(" -u        print unused\n");
	printf(" -b        print blocks\n");
	printf(" -p XXXX   set print mask, XXXX can be: ");
	for (i = 0; i < sizeof(printmasks) / sizeof(*printmasks) - 1; i++)
		printf("%s, ", printmasks[i].name);
	printf("%s\n", printmasks[i].name);

	printf("\nFor more details see code\n");
	return 1;
}